

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_until_node.hpp
# Opt level: O2

void __thiscall
ranger::bhvr_tree::
decorator_until_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec_impl(decorator_until_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
            *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                  *ap,
           abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
           *node,handler_type *hdl)

{
  _Function_base local_70;
  anon_class_56_4_3a710efc local_50;
  
  local_50.ap = ap;
  local_50.this = this;
  std::function<void_(bool,_test_agent_*)>::function(&local_50.hdl,hdl);
  local_50.node = node;
  std::function<void(bool,test_agent*)>::
  function<ranger::bhvr_tree::decorator_until_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::exec_impl(ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>&,ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>*,std::function<void(bool,test_agent*)>)const::_lambda(bool,test_agent*)_1_,void>
            ((function<void(bool,test_agent*)> *)&local_70,&local_50);
  (*node->_vptr_abstract_node[2])(node,ap,&local_70);
  std::_Function_base::~_Function_base(&local_70);
  std::_Function_base::~_Function_base(&local_50.hdl.super__Function_base);
  return;
}

Assistant:

void exec_impl(AgentProxy& ap,
                 abstract_node<AgentProxy>* node,
                 typename AgentProxy::handler_type hdl) const {
    node->exec(ap, [=, &ap] (bool result, typename AgentProxy::agent_type*) {
      if (result == m_expected) {
        ap(hdl, result);
      } else {
        exec_impl(ap, node, std::move(hdl));
      }
    });
  }